

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8 *ptr)

{
  uint8 *__src;
  uint8 *puVar1;
  uint8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  uint8 *puVar5;
  size_t __n;
  int size;
  uint local_44;
  uint8 *local_40;
  uint8 *local_38;
  
  __src = this->buffer_;
  local_40 = this->buffer_ + 0x10;
  do {
    puVar1 = this->buffer_end_;
    if (puVar1 == (uint8 *)0x0) {
LAB_001fd6db:
      this->buffer_end_ = ptr;
      return ((int)this->end_ - (int)ptr) + 0x10;
    }
    puVar2 = this->end_;
    if (ptr < puVar2 || (long)ptr - (long)puVar2 == 0) {
      if (puVar1 != (uint8 *)0x0) {
        __n = (long)ptr - (long)this->buffer_;
        memcpy(puVar1,this->buffer_,__n);
        this->buffer_end_ = this->buffer_end_ + __n;
        return (int)this->end_ - (int)ptr;
      }
      goto LAB_001fd6db;
    }
    puVar5 = __src;
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
      this->had_error_ = true;
      this->end_ = local_40;
    }
    else {
      memcpy(puVar1,__src,(long)puVar2 - (long)__src);
      do {
        iVar4 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_44);
        if ((char)iVar4 == '\0') {
          this->had_error_ = true;
          this->end_ = local_40;
          goto LAB_001fd68a;
        }
      } while ((ulong)local_44 == 0);
      puVar1 = this->end_;
      if ((int)local_44 < 0x11) {
        uVar3 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)__src = *(undefined8 *)puVar1;
        *(undefined8 *)(this->buffer_ + 8) = uVar3;
        this->buffer_end_ = local_38;
        this->end_ = __src + (int)local_44;
      }
      else {
        uVar3 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)local_38 = *(undefined8 *)puVar1;
        *(undefined8 *)(local_38 + 8) = uVar3;
        this->end_ = local_38 + ((ulong)local_44 - 0x10);
        this->buffer_end_ = (uint8 *)0x0;
        puVar5 = local_38;
      }
    }
LAB_001fd68a:
    ptr = puVar5 + (int)((long)ptr - (long)puVar2);
    if (this->had_error_ != false) {
      return 0;
    }
  } while( true );
}

Assistant:

int EpsCopyOutputStream::Flush(uint8* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}